

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_boundary.c
# Opt level: O2

int iterBoundaryAdvance(mpt_iterator *it)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = *(uint *)&it[6]._vptr;
  uVar3 = *(uint *)((long)&it[6]._vptr + 4);
  if (uVar3 < uVar1) {
    uVar3 = uVar3 + 1;
    *(uint *)((long)&it[6]._vptr + 4) = uVar3;
    iVar2 = 100;
    if (uVar3 == uVar1) {
      iVar2 = 0;
    }
    return iVar2;
  }
  return -0x10;
}

Assistant:

static int iterBoundaryAdvance(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(iteratorBoundary) *d = MPT_baseaddr(iteratorBoundary, it, _it);
	if (d->pos >= d->elem) {
		return MPT_ERROR(MissingData);
	}
	if (++d->pos == d->elem) {
		return 0;
	}
	return 'd';
}